

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_data.cpp
# Opt level: O3

unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
__thiscall
duckdb::StructColumnData::Checkpoint
          (StructColumnData *this,RowGroup *row_group,ColumnCheckpointInfo *checkpoint_info)

{
  PartialBlockManager *partial_block_manager;
  _Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false> _Var1;
  pointer psVar2;
  _Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false> _Var3;
  unique_ptr<duckdb::StructColumnCheckpointState,_std::default_delete<duckdb::StructColumnCheckpointState>_>
  this_00;
  pointer pSVar4;
  pointer pCVar5;
  undefined8 *in_RCX;
  pointer *__ptr;
  unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true> *sub_column;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false> local_48;
  _Head_base<0UL,_duckdb::StructColumnCheckpointState_*,_false> local_40;
  _Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false> local_38;
  
  partial_block_manager = *(PartialBlockManager **)*in_RCX;
  local_38._M_head_impl = (ColumnCheckpointState *)this;
  this_00._M_t.
  super___uniq_ptr_impl<duckdb::StructColumnCheckpointState,_std::default_delete<duckdb::StructColumnCheckpointState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::StructColumnCheckpointState_*,_std::default_delete<duckdb::StructColumnCheckpointState>_>
  .super__Head_base<0UL,_duckdb::StructColumnCheckpointState_*,_false>._M_head_impl =
       (__uniq_ptr_data<duckdb::StructColumnCheckpointState,_std::default_delete<duckdb::StructColumnCheckpointState>,_true,_true>
        )operator_new(0xb0);
  StructColumnCheckpointState::StructColumnCheckpointState
            ((StructColumnCheckpointState *)
             this_00._M_t.
             super___uniq_ptr_impl<duckdb::StructColumnCheckpointState,_std::default_delete<duckdb::StructColumnCheckpointState>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::StructColumnCheckpointState_*,_std::default_delete<duckdb::StructColumnCheckpointState>_>
             .super__Head_base<0UL,_duckdb::StructColumnCheckpointState_*,_false>._M_head_impl,
             (RowGroup *)checkpoint_info,(ColumnData *)row_group,partial_block_manager);
  local_40._M_head_impl =
       (StructColumnCheckpointState *)
       this_00._M_t.
       super___uniq_ptr_impl<duckdb::StructColumnCheckpointState,_std::default_delete<duckdb::StructColumnCheckpointState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::StructColumnCheckpointState_*,_std::default_delete<duckdb::StructColumnCheckpointState>_>
       .super__Head_base<0UL,_duckdb::StructColumnCheckpointState_*,_false>._M_head_impl;
  ColumnData::Checkpoint
            ((ColumnData *)&stack0xffffffffffffffb8,
             (RowGroup *)((long)&row_group[1].row_group_lock.super___mutex_base._M_mutex + 8),
             checkpoint_info);
  pSVar4 = unique_ptr<duckdb::StructColumnCheckpointState,_std::default_delete<duckdb::StructColumnCheckpointState>,_true>
           ::operator->((unique_ptr<duckdb::StructColumnCheckpointState,_std::default_delete<duckdb::StructColumnCheckpointState>,_true>
                         *)&stack0xffffffffffffffc0);
  _Var3._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (ColumnCheckpointState *)0x0;
  _Var1._M_head_impl =
       (pSVar4->validity_state).
       super_unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnCheckpointState_*,_std::default_delete<duckdb::ColumnCheckpointState>_>
       .super__Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false>._M_head_impl;
  (pSVar4->validity_state).
  super_unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnCheckpointState_*,_std::default_delete<duckdb::ColumnCheckpointState>_>
  .super__Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false>._M_head_impl = _Var3._M_head_impl;
  if ((_Var1._M_head_impl != (ColumnCheckpointState *)0x0) &&
     ((**(code **)((long)(_Var1._M_head_impl)->_vptr_ColumnCheckpointState + 8))(),
     (_Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false>)local_48._M_head_impl !=
     (_Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false>)0x0)) {
    (*(local_48._M_head_impl)->_vptr_ColumnCheckpointState[1])();
  }
  psVar2 = row_group[1].columns.
           super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
           .
           super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  for (this_01 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 row_group[1].columns.
                 super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                 .
                 super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish; (pointer)this_01 != psVar2;
      this_01 = this_01 + 1) {
    pSVar4 = unique_ptr<duckdb::StructColumnCheckpointState,_std::default_delete<duckdb::StructColumnCheckpointState>,_true>
             ::operator->((unique_ptr<duckdb::StructColumnCheckpointState,_std::default_delete<duckdb::StructColumnCheckpointState>,_true>
                           *)&stack0xffffffffffffffc0);
    pCVar5 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
             operator->((unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>
                         *)this_01);
    (*pCVar5->_vptr_ColumnData[0x1c])(&stack0xffffffffffffffb8,pCVar5,checkpoint_info);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,std::default_delete<duckdb::ColumnCheckpointState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,std::default_delete<duckdb::ColumnCheckpointState>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ColumnCheckpointState,std::default_delete<duckdb::ColumnCheckpointState>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,std::default_delete<duckdb::ColumnCheckpointState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,std::default_delete<duckdb::ColumnCheckpointState>,true>>>
                *)&pSVar4->child_states,
               (unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
                *)&stack0xffffffffffffffb8);
    if (local_48._M_head_impl != (ColumnCheckpointState *)0x0) {
      (*(local_48._M_head_impl)->_vptr_ColumnCheckpointState[1])();
    }
  }
  *(StructColumnCheckpointState **)local_38._M_head_impl = local_40._M_head_impl;
  return ((unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
           )(__uniq_ptr_impl<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
             )local_38._M_head_impl).
         super_unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
  ;
}

Assistant:

unique_ptr<ColumnCheckpointState> StructColumnData::Checkpoint(RowGroup &row_group,
                                                               ColumnCheckpointInfo &checkpoint_info) {
	auto checkpoint_state = make_uniq<StructColumnCheckpointState>(row_group, *this, checkpoint_info.info.manager);
	checkpoint_state->validity_state = validity.Checkpoint(row_group, checkpoint_info);
	for (auto &sub_column : sub_columns) {
		checkpoint_state->child_states.push_back(sub_column->Checkpoint(row_group, checkpoint_info));
	}
	return std::move(checkpoint_state);
}